

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O0

double __thiscall
Problem_CGBG_FF::ComputeLocalUtility
          (Problem_CGBG_FF *this,Index hI,Scope *tupleOfAgents,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *actions,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *types)

{
  pointer pdVar1;
  undefined1 uVar2;
  Problem_CGBG_FF *this_00;
  Index in_ESI;
  Problem_CGBG_FF *in_RDI;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double u_fl_ja;
  double p_fl__oVec;
  Index fl_1;
  double u_jt_ja;
  Index fl;
  vector<double,_std::allocator<double>_> p_oVec_fl;
  double p_oVec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> oVec_hI;
  size_t nrAgentsPresent;
  double in_stack_ffffffffffffff08;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  allocator_type *in_stack_ffffffffffffff20;
  Problem_CGBG_FF *in_stack_ffffffffffffff28;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff30;
  double in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff48;
  Problem_CGBG_FF *in_stack_ffffffffffffff50;
  uint local_98;
  double local_90;
  uint local_88;
  double local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffb0;
  Scope *in_stack_ffffffffffffffb8;
  Index in_stack_ffffffffffffffc4;
  double local_8;
  
  this_00 = (Problem_CGBG_FF *)
            ComputeNumberOfAgentsPresentAtHouse
                      (in_stack_ffffffffffffff50,(Index)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI);
  FilterObservationsForHouse
            (this_00,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  local_58 = 0.0;
  std::allocator<double>::allocator((allocator<double> *)0x8ed99f);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28,
             in_stack_ffffffffffffff20);
  std::allocator<double>::~allocator((allocator<double> *)0x8ed9c5);
  auVar4._0_8_ = in_stack_ffffffffffffff08;
  for (local_88 = 0; (ulong)local_88 < in_RDI->_m_nrFireLevels; local_88 = local_88 + 1) {
    in_stack_ffffffffffffff38 =
         Likelihood(in_RDI,(Index)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff30
                    ,(Index)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    dVar3 = Prior(in_RDI,in_ESI,local_88);
    in_stack_ffffffffffffff28 = (Problem_CGBG_FF *)(in_stack_ffffffffffffff38 * dVar3);
    in_stack_ffffffffffffff30 =
         (vector<double,_std::allocator<double>_> *)
         std::vector<double,_std::allocator<double>_>::at
                   (in_stack_ffffffffffffff10,(size_type)auVar4._0_8_);
    (in_stack_ffffffffffffff30->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffff28;
    in_stack_ffffffffffffff20 =
         (allocator_type *)
         std::vector<double,_std::allocator<double>_>::at
                   (in_stack_ffffffffffffff10,(size_type)auVar4._0_8_);
    local_58 = *(double *)in_stack_ffffffffffffff20 + local_58;
  }
  local_90 = 0.0;
  uVar2 = Globals::EqualProbability((double)in_stack_ffffffffffffff10,auVar4._0_8_);
  if ((bool)uVar2) {
    local_8 = 0.0;
  }
  else {
    for (local_98 = 0; (ulong)local_98 < in_RDI->_m_nrFireLevels; local_98 = local_98 + 1) {
      in_stack_ffffffffffffff10 =
           (vector<double,_std::allocator<double>_> *)
           std::vector<double,_std::allocator<double>_>::at
                     (in_stack_ffffffffffffff10,(size_type)auVar4._0_8_);
      pdVar1 = (in_stack_ffffffffffffff10->super__Vector_base<double,_std::allocator<double>_>).
               _M_impl.super__Vector_impl_data._M_start;
      auVar4._0_8_ = GetHouseReward(in_stack_ffffffffffffff28,
                                    (Index)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                                    CONCAT17(uVar2,in_stack_ffffffffffffff18));
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (double)pdVar1 / local_58;
      auVar4._8_8_ = 0;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_90;
      auVar5 = vfmadd213sd_fma(auVar4,auVar5,auVar6);
      local_90 = auVar5._0_8_;
    }
    local_8 = local_90;
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff20);
  return local_8;
}

Assistant:

double Problem_CGBG_FF::ComputeLocalUtility( 
        Index hI, 
        const Scope& tupleOfAgents,
        const vector<Index>& actions,
        const vector<Index>& types
        )
{
#if DEBUGUTILS    
    cout << "ComputeLocalUtility( " 
         << "hI=" << hI 
         << ", tupleOfAgents=" << tupleOfAgents
         << ", actions=" << PrintTools::SoftPrintVector(actions)
         << ", types=" << PrintTools::SoftPrintVector(types)
         << endl;
#endif

    size_t nrAgentsPresent = ComputeNumberOfAgentsPresentAtHouse(hI, actions);
    
    //compute the probabilities over the firelevels of this house, given the joint type
    //and compute 
    //      U^e(jt_e,ja_e) = \sum_s_e P(s_e|jt_e) R^e(s_e,ja_e)
    //(where e corresponds to this house hI)
    //
    //However, in this problem we have some simplying assumptions.
    //E.g., extending the example introduced above, for house 2, we have:
    //      U2(t1t2,a1a2) = \sum_s2 P(s2|t1t2) R(s2|a1a2)
    //
    //Here of course  P(s2|t1t2) =  P(s2,t1t2)/ P(t1t2)
    //
    //However <t1,t2> specify multiple observations, only some of which pertain to house 2,
    //let's rewrite <t1t2> = <h21,h22,hx1,hx2> 
    //(where hxi are to observations of agent i about different houses)
    //
    //  P(s2|h21,h22,hx1,hx2) = P(h21,h22,hx1,hx2|s2) P(s2) / P( h21,h22,hx1,hx2 )
    //                        = P(h21|s2)P(h22|s2)P(s2)P(hx1)P(hx2) / (P(hx1)P(hx2)*\sum_{s2} P(h21|s2)P(h22|s2)P(s2) )
    //                        = P(h21|s2)P(h22|s2)P(s2) / \sum_{s2} P(h21|s2)P(h22|s2)P(s2) 
    //                        = P(s2|h21,h22)
    //

    vector<Problem_CGBG_FF::observation_t> oVec_hI = 
        FilterObservationsForHouse(hI, tupleOfAgents, types);

    double p_oVec = 0.0;
    vector<double> p_oVec_fl(_m_nrFireLevels);
    for(Index fl=0; fl < _m_nrFireLevels; fl++)
    {
        p_oVec_fl.at(fl) = Likelihood(hI, oVec_hI, fl) * Prior(hI, fl);
        p_oVec += p_oVec_fl.at(fl);
        //cout << "\tP(oVec, FL="<<fl<<") = " << p_oVec_fl.at(fl) << endl;        
    }
    //cout << "P(oVec)="<< p_oVec << endl;

    double u_jt_ja = 0.0;

    if(EqualProbability(p_oVec,0.0))
        return(0.0);

    for(Index fl=0; fl < _m_nrFireLevels; fl++)
    {
        double p_fl__oVec = p_oVec_fl.at(fl) / p_oVec;
        double u_fl_ja = GetHouseReward(fl, nrAgentsPresent);
        //cout << "\tp_fl__oVec="<<p_fl__oVec<<" u_fl_ja="<<u_fl_ja<<endl;
        u_jt_ja += p_fl__oVec * u_fl_ja;
    }
#if DEBUGUTILS    
    cout << "u_jt_ja="<<u_jt_ja<<endl;
    if(isnan(u_jt_ja))
        abort();
#endif
    return u_jt_ja;
}